

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDatum.h
# Opt level: O1

void __thiscall MinVR::VRDatumString::VRDatumString(VRDatumString *this,VRString *inVal)

{
  pointer pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  pcVar1 = (inVal->_M_dataplus)._M_p;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,pcVar1,pcVar1 + inVal->_M_string_length);
  VRDatumSpecialized<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(MinVR::VRCORETYPE_ID)3>
  ::VRDatumSpecialized
            (&this->
              super_VRDatumSpecialized<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(MinVR::VRCORETYPE_ID)3>
             ,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  (this->
  super_VRDatumSpecialized<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(MinVR::VRCORETYPE_ID)3>
  ).super_VRDatum._vptr_VRDatum = (_func_int **)&PTR__VRDatumSpecialized_00176bd8;
  return;
}

Assistant:

VRDatumString(const VRString inVal) :
    VRDatumSpecialized<VRString, VRCORETYPE_STRING>(inVal) {}